

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::FieldDescriptorProto::MergeFrom
          (FieldDescriptorProto *this,FieldDescriptorProto *from)

{
  byte bVar1;
  int32 iVar2;
  int iVar3;
  char cVar4;
  uint uVar5;
  LogMessage *other;
  string *psVar6;
  FieldOptions *this_00;
  FieldOptions *from_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.pb.cc"
               ,0xb7a);
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage(&local_50);
  }
  bVar1 = (byte)from->_has_bits_[0];
  uVar5 = (uint)bVar1;
  if (bVar1 != 0) {
    if ((bVar1 & 1) != 0) {
      this->_has_bits_[0] = this->_has_bits_[0] | 1;
      psVar6 = this->name_;
      if (psVar6 == (string *)internal::kEmptyString_abi_cxx11_) {
        psVar6 = (string *)operator_new(0x20);
        (psVar6->_M_dataplus)._M_p = (pointer)&psVar6->field_2;
        psVar6->_M_string_length = 0;
        (psVar6->field_2)._M_local_buf[0] = '\0';
        this->name_ = psVar6;
      }
      std::__cxx11::string::_M_assign((string *)psVar6);
      uVar5 = from->_has_bits_[0];
    }
    if ((uVar5 & 2) != 0) {
      iVar2 = from->number_;
      this->_has_bits_[0] = this->_has_bits_[0] | 2;
      this->number_ = iVar2;
      uVar5 = from->_has_bits_[0];
    }
    if ((uVar5 & 4) != 0) {
      iVar3 = from->label_;
      if (2 < iVar3 - 1U) {
        __assert_fail("::google::protobuf::FieldDescriptorProto_Label_IsValid(value)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/descriptor.pb.h"
                      ,0xe16,
                      "void google::protobuf::FieldDescriptorProto::set_label(::google::protobuf::FieldDescriptorProto_Label)"
                     );
      }
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 4;
      this->label_ = iVar3;
      uVar5 = from->_has_bits_[0];
    }
    if ((uVar5 & 8) != 0) {
      iVar3 = from->type_;
      if (0x11 < iVar3 - 1U) {
        __assert_fail("::google::protobuf::FieldDescriptorProto_Type_IsValid(value)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/descriptor.pb.h"
                      ,0xe2d,
                      "void google::protobuf::FieldDescriptorProto::set_type(::google::protobuf::FieldDescriptorProto_Type)"
                     );
      }
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 8;
      this->type_ = iVar3;
      uVar5 = from->_has_bits_[0];
    }
    if ((uVar5 & 0x10) != 0) {
      this->_has_bits_[0] = this->_has_bits_[0] | 0x10;
      psVar6 = this->type_name_;
      if (psVar6 == (string *)internal::kEmptyString_abi_cxx11_) {
        psVar6 = (string *)operator_new(0x20);
        (psVar6->_M_dataplus)._M_p = (pointer)&psVar6->field_2;
        psVar6->_M_string_length = 0;
        (psVar6->field_2)._M_local_buf[0] = '\0';
        this->type_name_ = psVar6;
      }
      std::__cxx11::string::_M_assign((string *)psVar6);
      uVar5 = from->_has_bits_[0];
    }
    if ((uVar5 & 0x20) != 0) {
      this->_has_bits_[0] = this->_has_bits_[0] | 0x20;
      psVar6 = this->extendee_;
      if (psVar6 == (string *)internal::kEmptyString_abi_cxx11_) {
        psVar6 = (string *)operator_new(0x20);
        (psVar6->_M_dataplus)._M_p = (pointer)&psVar6->field_2;
        psVar6->_M_string_length = 0;
        (psVar6->field_2)._M_local_buf[0] = '\0';
        this->extendee_ = psVar6;
      }
      std::__cxx11::string::_M_assign((string *)psVar6);
      uVar5 = from->_has_bits_[0];
    }
    cVar4 = (char)uVar5;
    if ((uVar5 & 0x40) != 0) {
      this->_has_bits_[0] = this->_has_bits_[0] | 0x40;
      psVar6 = this->default_value_;
      if (psVar6 == (string *)internal::kEmptyString_abi_cxx11_) {
        psVar6 = (string *)operator_new(0x20);
        (psVar6->_M_dataplus)._M_p = (pointer)&psVar6->field_2;
        psVar6->_M_string_length = 0;
        (psVar6->field_2)._M_local_buf[0] = '\0';
        this->default_value_ = psVar6;
      }
      std::__cxx11::string::_M_assign((string *)psVar6);
      cVar4 = (char)from->_has_bits_[0];
    }
    if (cVar4 < '\0') {
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 0x80;
      this_00 = this->options_;
      if (this_00 == (FieldOptions *)0x0) {
        this_00 = (FieldOptions *)operator_new(0x70);
        FieldOptions::FieldOptions(this_00);
        this->options_ = this_00;
      }
      from_00 = from->options_;
      if (from_00 == (FieldOptions *)0x0) {
        from_00 = *(FieldOptions **)(default_instance_ + 0x38);
      }
      FieldOptions::MergeFrom(this_00,from_00);
    }
  }
  UnknownFieldSet::MergeFrom(&this->_unknown_fields_,&from->_unknown_fields_);
  return;
}

Assistant:

void FieldDescriptorProto::MergeFrom(const FieldDescriptorProto& from) {
  GOOGLE_CHECK_NE(&from, this);
  if (from._has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    if (from.has_name()) {
      set_name(from.name());
    }
    if (from.has_number()) {
      set_number(from.number());
    }
    if (from.has_label()) {
      set_label(from.label());
    }
    if (from.has_type()) {
      set_type(from.type());
    }
    if (from.has_type_name()) {
      set_type_name(from.type_name());
    }
    if (from.has_extendee()) {
      set_extendee(from.extendee());
    }
    if (from.has_default_value()) {
      set_default_value(from.default_value());
    }
    if (from.has_options()) {
      mutable_options()->::google::protobuf::FieldOptions::MergeFrom(from.options());
    }
  }
  mutable_unknown_fields()->MergeFrom(from.unknown_fields());
}